

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::Precompute::create(Precompute *this)

{
  unique_ptr<wasm::Precompute,_std::default_delete<wasm::Precompute>_> local_20 [2];
  Precompute *this_local;
  
  this_local = this;
  std::make_unique<wasm::Precompute,bool&>((bool *)local_20);
  std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
  unique_ptr<wasm::Precompute,std::default_delete<wasm::Precompute>,void>
            ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)this,local_20);
  std::unique_ptr<wasm::Precompute,_std::default_delete<wasm::Precompute>_>::~unique_ptr(local_20);
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<Precompute>(propagate);
  }